

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O3

void __thiscall
cmGlobalGenerator::CheckCompilerIdCompatibility(cmGlobalGenerator *this,cmMakefile *mf,string *lang)

{
  pointer pcVar1;
  bool bVar2;
  int iVar3;
  PolicyStatus PVar4;
  string *psVar5;
  ostream *poVar6;
  PolicyID id;
  PolicyID id_00;
  PolicyID id_01;
  PolicyID id_02;
  PolicyID id_03;
  PolicyID id_04;
  PolicyID id_05;
  PolicyID id_06;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_01;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_02;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view value_02;
  string_view value_03;
  string_view value_04;
  string_view value_05;
  string_view value_06;
  string_view value_07;
  string_view value_08;
  string version;
  string compilerId;
  ostringstream w;
  string compilerIdVar;
  string emulated;
  string emulatedId;
  string local_248;
  long *local_228 [2];
  long local_218 [2];
  undefined1 local_208 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f8;
  pointer local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  char *local_1d0;
  undefined8 local_1c8;
  ios_base local_198 [264];
  string local_90;
  string local_70;
  string local_50;
  
  local_208._0_8_ =
       (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        *)0x6;
  local_208._8_8_ = "CMAKE_";
  local_1f8._M_allocated_capacity = 0;
  local_1e8 = (lang->_M_dataplus)._M_p;
  local_1f8._8_8_ = lang->_M_string_length;
  local_1e0 = 0;
  local_1d8 = 0xc;
  local_1d0 = "_COMPILER_ID";
  local_1c8 = 0;
  views._M_len = 3;
  views._M_array = (iterator)local_208;
  cmCatViews(&local_90,views);
  psVar5 = cmMakefile::GetSafeDefinition(mf,&local_90);
  local_228[0] = local_218;
  pcVar1 = (psVar5->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_228,pcVar1,pcVar1 + psVar5->_M_string_length);
  iVar3 = std::__cxx11::string::compare((char *)local_228);
  if (iVar3 == 0) {
    PVar4 = cmMakefile::GetPolicyStatus(mf,CMP0025,false);
    if (PVar4 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_
                ((string *)local_208,(cmPolicies *)&DAT_00000019,id_01);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._0_8_ != &local_1f8) {
        operator_delete((void *)local_208._0_8_,(ulong)(local_1f8._M_allocated_capacity + 1));
      }
    }
    else {
      if (PVar4 != OLD) {
        if (PVar4 != WARN) goto LAB_002331c8;
        bVar2 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (!bVar2) {
          local_208._0_8_ = &local_1f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_208,"CMAKE_POLICY_WARNING_CMP0025","");
          bVar2 = cmMakefile::PolicyOptionalWarningEnabled(mf,(string *)local_208);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._0_8_ != &local_1f8) {
            operator_delete((void *)local_208._0_8_,(ulong)(local_1f8._M_allocated_capacity + 1));
          }
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_248,(cmPolicies *)&DAT_00000019,id_02);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_208,local_248._M_dataplus._M_p,
                                local_248._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nConverting ",0xc);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(lang->_M_dataplus)._M_p,lang->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," compiler id \"AppleClang\" to \"Clang\" for compatibility.",0x37);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
            std::ios_base::~ios_base(local_198);
          }
        }
      }
      value_01._M_str = "Clang";
      value_01._M_len = 5;
      cmMakefile::AddDefinition(mf,&local_90,value_01);
    }
  }
LAB_002331c8:
  iVar3 = std::__cxx11::string::compare((char *)local_228);
  if (iVar3 == 0) {
    PVar4 = cmMakefile::GetPolicyStatus(mf,CMP0047,false);
    if (PVar4 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_208,(cmPolicies *)0x2f,id_03);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._0_8_ != &local_1f8) {
        operator_delete((void *)local_208._0_8_,(ulong)(local_1f8._M_allocated_capacity + 1));
      }
    }
    else {
      if (PVar4 != OLD) {
        if (PVar4 != WARN) goto LAB_002331e1;
        bVar2 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (!bVar2) {
          local_208._0_8_ = &local_1f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_208,"CMAKE_POLICY_WARNING_CMP0047","");
          bVar2 = cmMakefile::PolicyOptionalWarningEnabled(mf,(string *)local_208);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._0_8_ != &local_1f8) {
            operator_delete((void *)local_208._0_8_,(ulong)(local_1f8._M_allocated_capacity + 1));
          }
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_248,(cmPolicies *)0x2f,id_04);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_208,local_248._M_dataplus._M_p,
                                local_248._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nConverting ",0xc);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(lang->_M_dataplus)._M_p,lang->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," compiler id \"QCC\" to \"GNU\" for compatibility.",0x2e);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
            std::ios_base::~ios_base(local_198);
          }
        }
      }
      value_02._M_str = "GNU";
      value_02._M_len = 3;
      cmMakefile::AddDefinition(mf,&local_90,value_02);
      iVar3 = std::__cxx11::string::compare((char *)lang);
      if (iVar3 == 0) {
        local_208._0_8_ = &local_1f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_208,"CMAKE_COMPILER_IS_GNUCC","");
        value_05._M_str = "1";
        value_05._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)local_208,value_05);
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)lang);
        if (iVar3 != 0) goto LAB_002331e1;
        local_208._0_8_ = &local_1f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_208,"CMAKE_COMPILER_IS_GNUCXX","");
        value_03._M_str = "1";
        value_03._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)local_208,value_03);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._0_8_ != &local_1f8) {
        operator_delete((void *)local_208._0_8_,(ulong)(local_1f8._M_allocated_capacity + 1));
      }
    }
  }
LAB_002331e1:
  iVar3 = std::__cxx11::string::compare((char *)local_228);
  if (iVar3 == 0) {
    PVar4 = cmMakefile::GetPolicyStatus(mf,CMP0089,false);
    if (PVar4 - REQUIRED_IF_USED < 2) {
      cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_208,(cmPolicies *)0x59,id_05);
      cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_208);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._0_8_ != &local_1f8) {
        operator_delete((void *)local_208._0_8_,(ulong)(local_1f8._M_allocated_capacity + 1));
      }
    }
    else {
      if (PVar4 != OLD) {
        if (PVar4 != WARN) goto LAB_002331fa;
        bVar2 = cmake::GetIsInTryCompile(this->CMakeInstance);
        if (!bVar2) {
          local_208._0_8_ = &local_1f8;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_208,"CMAKE_POLICY_WARNING_CMP0089","");
          bVar2 = cmMakefile::PolicyOptionalWarningEnabled(mf,(string *)local_208);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_208._0_8_ != &local_1f8) {
            operator_delete((void *)local_208._0_8_,(ulong)(local_1f8._M_allocated_capacity + 1));
          }
          if (bVar2) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
            cmPolicies::GetPolicyWarning_abi_cxx11_(&local_248,(cmPolicies *)0x59,id_06);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               ((ostream *)local_208,local_248._M_dataplus._M_p,
                                local_248._M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nConverting ",0xc);
            poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                               (poVar6,(lang->_M_dataplus)._M_p,lang->_M_string_length);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar6," compiler id \"XLClang\" to \"XL\" for compatibility.",0x31);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::stringbuf::str();
            cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_248);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1
                             );
            }
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
            std::ios_base::~ios_base(local_198);
          }
        }
      }
      value_04._M_str = "XL";
      value_04._M_len = 2;
      cmMakefile::AddDefinition(mf,&local_90,value_04);
    }
  }
LAB_002331fa:
  iVar3 = std::__cxx11::string::compare((char *)local_228);
  if (iVar3 != 0) goto LAB_00233c90;
  PVar4 = cmMakefile::GetPolicyStatus(mf,CMP0129,false);
  if (PVar4 - REQUIRED_IF_USED < 2) {
    cmPolicies::GetRequiredPolicyError_abi_cxx11_((string *)local_208,(cmPolicies *)0x81,id);
    cmMakefile::IssueMessage(mf,FATAL_ERROR,(string *)local_208);
    local_248.field_2._M_allocated_capacity = local_1f8._M_allocated_capacity;
    local_248._M_dataplus._M_p = (pointer)local_208._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_208._0_8_ == &local_1f8) goto LAB_00233c90;
  }
  else {
    if (PVar4 != OLD) {
      if (PVar4 != WARN) goto LAB_00233c90;
      bVar2 = cmake::GetIsInTryCompile(this->CMakeInstance);
      if (!bVar2) {
        local_208._0_8_ = &local_1f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_208,"CMAKE_POLICY_WARNING_CMP0129","");
        bVar2 = cmMakefile::PolicyOptionalWarningEnabled(mf,(string *)local_208);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208._0_8_ != &local_1f8) {
          operator_delete((void *)local_208._0_8_,(ulong)(local_1f8._M_allocated_capacity + 1));
        }
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_208);
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_248,(cmPolicies *)0x81,id_00);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_208,local_248._M_dataplus._M_p,
                              local_248._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar6,"\nConverting ",0xc);
          poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar6,(lang->_M_dataplus)._M_p,lang->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar6," compiler id \"LCC\" to \"GNU\" for compatibility.",0x2e);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(mf,AUTHOR_WARNING,&local_248);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != &local_248.field_2) {
            operator_delete(local_248._M_dataplus._M_p,local_248.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_208);
          std::ios_base::~ios_base(local_198);
        }
      }
    }
    value._M_str = "GNU";
    value._M_len = 3;
    cmMakefile::AddDefinition(mf,&local_90,value);
    iVar3 = std::__cxx11::string::compare((char *)lang);
    if (iVar3 == 0) {
      local_208._0_8_ = &local_1f8;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_208,"CMAKE_COMPILER_IS_GNUCC","");
      value_06._M_str = "1";
      value_06._M_len = 1;
      cmMakefile::AddDefinition(mf,(string *)local_208,value_06);
LAB_00233ae9:
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._0_8_ != &local_1f8) {
        operator_delete((void *)local_208._0_8_,(ulong)(local_1f8._M_allocated_capacity + 1));
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)lang);
      if (iVar3 == 0) {
        local_208._0_8_ = &local_1f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_208,"CMAKE_COMPILER_IS_GNUCXX","");
        value_07._M_str = "1";
        value_07._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)local_208,value_07);
        goto LAB_00233ae9;
      }
      iVar3 = std::__cxx11::string::compare((char *)lang);
      if (iVar3 == 0) {
        local_208._0_8_ = &local_1f8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_208,"CMAKE_COMPILER_IS_GNUG77","");
        value_00._M_str = "1";
        value_00._M_len = 1;
        cmMakefile::AddDefinition(mf,(string *)local_208,value_00);
        goto LAB_00233ae9;
      }
    }
    local_208._0_8_ = (pointer)0x6;
    local_208._8_8_ = "CMAKE_";
    local_1f8._M_allocated_capacity = 0;
    local_1e8 = (lang->_M_dataplus)._M_p;
    local_1f8._8_8_ = lang->_M_string_length;
    local_1e0 = 0;
    local_1d8 = 0x11;
    local_1d0 = "_COMPILER_VERSION";
    local_1c8 = 0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)local_208;
    cmCatViews(&local_248,views_00);
    local_208._0_8_ = (pointer)0x6;
    local_208._8_8_ = "CMAKE_";
    local_1f8._M_allocated_capacity = 0;
    local_1e8 = (lang->_M_dataplus)._M_p;
    local_1f8._8_8_ = lang->_M_string_length;
    local_1e0 = 0;
    local_1d8 = 0x11;
    local_1d0 = "_SIMULATE_VERSION";
    local_1c8 = 0;
    views_01._M_len = 3;
    views_01._M_array = (iterator)local_208;
    cmCatViews(&local_70,views_01);
    local_208._0_8_ =
         (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
          *)0x6;
    local_208._8_8_ = "CMAKE_";
    local_1f8._M_allocated_capacity = 0;
    local_1e8 = (lang->_M_dataplus)._M_p;
    local_1f8._8_8_ = lang->_M_string_length;
    local_1e0 = 0;
    local_1d8 = 0xc;
    local_1d0 = "_SIMULATE_ID";
    local_1c8 = 0;
    views_02._M_len = 3;
    views_02._M_array = (iterator)local_208;
    cmCatViews(&local_50,views_02);
    psVar5 = cmMakefile::GetRequiredDefinition(mf,&local_70);
    value_08._M_str = (psVar5->_M_dataplus)._M_p;
    value_08._M_len = psVar5->_M_string_length;
    cmMakefile::AddDefinition(mf,&local_248,value_08);
    cmMakefile::RemoveDefinition(mf,&local_50);
    cmMakefile::RemoveDefinition(mf,&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p == &local_248.field_2) goto LAB_00233c90;
  }
  operator_delete(local_248._M_dataplus._M_p,
                  (ulong)((long)&(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)local_248.field_2._M_allocated_capacity)->_M_dataplus)._M_p +
                         1));
LAB_00233c90:
  if (local_228[0] != local_218) {
    operator_delete(local_228[0],local_218[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmGlobalGenerator::CheckCompilerIdCompatibility(
  cmMakefile* mf, std::string const& lang) const
{
  std::string compilerIdVar = cmStrCat("CMAKE_", lang, "_COMPILER_ID");
  std::string const compilerId = mf->GetSafeDefinition(compilerIdVar);

  if (compilerId == "AppleClang") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0025)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0025")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0025) << "\n"
            "Converting " << lang <<
            R"( compiler id "AppleClang" to "Clang" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert AppleClang to Clang.
        mf->AddDefinition(compilerIdVar, "Clang");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0025));
        break;
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (compilerId == "QCC") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0047)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0047")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0047) << "\n"
            "Converting " << lang <<
            R"( compiler id "QCC" to "GNU" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert QCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0047));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep QCC.
        break;
    }
  }

  if (compilerId == "XLClang") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0089)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0089")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0089) << "\n"
            "Converting " << lang <<
            R"( compiler id "XLClang" to "XL" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert XLClang to XL.
        mf->AddDefinition(compilerIdVar, "XL");
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0089));
        break;
      case cmPolicies::NEW:
        // NEW behavior is to keep AppleClang.
        break;
    }
  }

  if (compilerId == "LCC") {
    switch (mf->GetPolicyStatus(cmPolicies::CMP0129)) {
      case cmPolicies::WARN:
        if (!this->CMakeInstance->GetIsInTryCompile() &&
            mf->PolicyOptionalWarningEnabled("CMAKE_POLICY_WARNING_CMP0129")) {
          std::ostringstream w;
          /* clang-format off */
          w << cmPolicies::GetPolicyWarning(cmPolicies::CMP0129) << "\n"
            "Converting " << lang <<
            R"( compiler id "LCC" to "GNU" for compatibility.)"
            ;
          /* clang-format on */
          mf->IssueMessage(MessageType::AUTHOR_WARNING, w.str());
        }
        CM_FALLTHROUGH;
      case cmPolicies::OLD:
        // OLD behavior is to convert LCC to GNU.
        mf->AddDefinition(compilerIdVar, "GNU");
        if (lang == "C") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCC", "1");
        } else if (lang == "CXX") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUCXX", "1");
        } else if (lang == "Fortran") {
          mf->AddDefinition("CMAKE_COMPILER_IS_GNUG77", "1");
        }
        {
          // Fix compiler versions.
          std::string version = cmStrCat("CMAKE_", lang, "_COMPILER_VERSION");
          std::string emulated = cmStrCat("CMAKE_", lang, "_SIMULATE_VERSION");
          std::string emulatedId = cmStrCat("CMAKE_", lang, "_SIMULATE_ID");
          std::string const& actual = mf->GetRequiredDefinition(emulated);
          mf->AddDefinition(version, actual);
          mf->RemoveDefinition(emulatedId);
          mf->RemoveDefinition(emulated);
        }
        break;
      case cmPolicies::REQUIRED_IF_USED:
      case cmPolicies::REQUIRED_ALWAYS:
        mf->IssueMessage(
          MessageType::FATAL_ERROR,
          cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0129));
        CM_FALLTHROUGH;
      case cmPolicies::NEW:
        // NEW behavior is to keep LCC.
        break;
    }
  }
}